

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O0

FT_Error TT_Get_MM_Blend(TT_Face face,FT_UInt num_coords,FT_Fixed *coords)

{
  GX_Blend pGVar1;
  uint local_40;
  uint local_3c;
  FT_UInt nc;
  FT_UInt i;
  GX_Blend blend;
  FT_Error error;
  FT_Fixed *coords_local;
  FT_UInt num_coords_local;
  TT_Face face_local;
  
  if (((face->blend != (GX_Blend)0x0) ||
      (face_local._4_4_ = TT_Get_MM_Var(face,(FT_MM_Var **)0x0), face_local._4_4_ == 0)) &&
     ((pGVar1 = face->blend, pGVar1->coords != (FT_Fixed *)0x0 ||
      (face_local._4_4_ = tt_set_mm_blend(face,0,(FT_Fixed *)0x0,'\x01'), face_local._4_4_ == 0))))
  {
    local_40 = num_coords;
    if (pGVar1->num_axis < num_coords) {
      local_40 = pGVar1->num_axis;
    }
    if (face->doblend == '\0') {
      for (local_3c = 0; local_3c < local_40; local_3c = local_3c + 1) {
        coords[local_3c] = 0;
      }
    }
    else {
      for (local_3c = 0; local_3c < local_40; local_3c = local_3c + 1) {
        coords[local_3c] = pGVar1->normalizedcoords[local_3c];
      }
    }
    for (; local_3c < num_coords; local_3c = local_3c + 1) {
      coords[local_3c] = 0;
    }
    face_local._4_4_ = 0;
  }
  return face_local._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  TT_Get_MM_Blend( TT_Face    face,
                   FT_UInt    num_coords,
                   FT_Fixed*  coords )
  {
    FT_Error  error = FT_Err_Ok;
    GX_Blend  blend;
    FT_UInt   i, nc;


    if ( !face->blend )
    {
      if ( FT_SET_ERROR( TT_Get_MM_Var( face, NULL ) ) )
        return error;
    }

    blend = face->blend;

    if ( !blend->coords )
    {
      /* select default instance coordinates */
      /* if no instance is selected yet      */
      if ( FT_SET_ERROR( tt_set_mm_blend( face, 0, NULL, 1 ) ) )
        return error;
    }

    nc = num_coords;
    if ( num_coords > blend->num_axis )
    {
      FT_TRACE2(( "TT_Get_MM_Blend:"
                  " only using first %d of %d coordinates\n",
                  blend->num_axis, num_coords ));
      nc = blend->num_axis;
    }

    if ( face->doblend )
    {
      for ( i = 0; i < nc; i++ )
        coords[i] = blend->normalizedcoords[i];
    }
    else
    {
      for ( i = 0; i < nc; i++ )
        coords[i] = 0;
    }

    for ( ; i < num_coords; i++ )
      coords[i] = 0;

    return FT_Err_Ok;
  }